

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QString.cpp
# Opt level: O3

QToken * QToken::high_wildcard(QToken *__return_storage_ptr__,uint8_t val)

{
  runtime_error *this;
  int iVar1;
  uchar local_49;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (val < 0x10) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(&local_48,0x10);
    iVar1 = 0;
    do {
      local_49 = val + (char)iVar1;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&local_48,&local_49);
      iVar1 = iVar1 + 0x10;
    } while (iVar1 != 0x100);
    (__return_storage_ptr__->opts_).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->opts_).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->opts_).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"format of high_wildcard is 0x0X");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

QToken QToken::high_wildcard(uint8_t val) {
    std::vector<uint8_t> options;
    if ((val & 0xF0) != 0) {
        throw std::runtime_error("format of high_wildcard is 0x0X");
    }
    options.reserve(16);
    for (int i = 0; i < 16; i++) {
        options.push_back((static_cast<uint8_t>(i << 4) | val));
    }
    return QToken(std::move(options));
}